

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

predict_type
recall_tree_ns::predict_from(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  float fVar1;
  label_t lVar2;
  uint32_t uVar3;
  node *pnVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar2 = (ec->l).multi;
  fVar1 = (ec->pred).scalar;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar4 = (b->nodes)._begin;
  uVar6 = (ulong)cn;
  do {
    uVar5 = uVar6;
    if (pnVar4[uVar5].internal != true) break;
    LEARNER::learner<char,_example>::predict(base,ec,(ulong)pnVar4[uVar5].base_router);
    pnVar4 = (b->nodes)._begin;
    uVar6 = (ulong)(&pnVar4[uVar5].left)
                   [0.0 < ec->partial_prediction || ec->partial_prediction == 0.0];
  } while ((b->bern_hyper <= 0.0) || (pnVar4[uVar5].recall_lbest < pnVar4[uVar6].recall_lbest));
  (ec->l).multi = lVar2;
  (ec->pred).scalar = fVar1;
  uVar3 = oas_predict(b,base,(uint32_t)uVar5,ec);
  return (predict_type)((ulong)uVar3 << 0x20 | uVar5);
}

Assistant:

predict_type predict_from(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_router);
    uint32_t newcn = descend(b.nodes[cn], ec.partial_prediction);
    bool cond = stop_recurse_check(b, cn, newcn);

    if (cond)
      break;

    cn = newcn;
  }

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return predict_type(cn, oas_predict(b, base, cn, ec));
}